

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

void __thiscall
ft::treeBase<char,_char,_char,_ft::less<char>,_ft::allocator<char>_>::attach
          (treeBase<char,_char,_char,_ft::less<char>,_ft::allocator<char>_> *this)

{
  treeNode<char> *ptVar1;
  treeNode<char> *ptVar2;
  treeNode<char> *ptVar3;
  treeNode<char> *ptVar4;
  treeNode<char> *ptVar5;
  
  ptVar1 = (this->m_tree).NIL;
  ptVar2 = (this->m_tree).m_root;
  ptVar3 = (this->m_tree).m_first;
  ptVar4 = ptVar2;
  do {
    ptVar5 = ptVar4;
    ptVar4 = ptVar5->left;
    if (ptVar4 == ptVar1) break;
  } while (ptVar4 != ptVar3);
  ptVar5->left = ptVar3;
  ptVar3->parent = ptVar5;
  ptVar3 = (this->m_tree).m_last;
  do {
    ptVar4 = ptVar2;
    ptVar2 = ptVar4->right;
    if (ptVar2 == ptVar1) break;
  } while (ptVar2 != ptVar3);
  ptVar4->right = ptVar3;
  ptVar3->parent = ptVar4;
  return;
}

Assistant:

void 	attach() {
		node*	f = this->root();
		node*	l = this->root();

		while (f->left != this->NIL() && f->left != this->firstNode()) {
			f = f->left;
		}

		f->left = this->firstNode();
		this->firstNode()->parent = f;

		while (l->right != this->NIL() && l->right != this->lastNode()) {
			l = l->right;
		}

		l->right = this->lastNode();
		this->lastNode()->parent = l;
	}